

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

string * __thiscall
NTrodeObj::getPrintStr_abi_cxx11_(string *__return_storage_ptr__,NTrodeObj *this,int indent)

{
  pointer piVar1;
  string *psVar2;
  ostream *poVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  string indentStr;
  ostringstream oss;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"    ","");
  if (0 < indent) {
    iVar5 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1d0,local_1c8);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Printing \'NTrodeObj\'\n",0x15);
  if (0 < indent) {
    iVar5 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1d0,local_1c8);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    -id : ",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->id)._M_dataplus._M_p,(this->id)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (0 < indent) {
    iVar5 = indent;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1d0,local_1c8);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    -hw_chans vector size[",0x1a);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]:\n",3);
  local_1b0 = __return_storage_ptr__;
  if (0 < (int)((ulong)((long)(this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)(this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    uVar6 = 0;
    do {
      iVar5 = indent;
      if (0 < indent) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_1d0,local_1c8);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"        - i[",0xc);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)uVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] : ",4);
      piVar1 = (this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar6) {
        uVar4 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar6);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar4);
      }
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,piVar1[uVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 <
             (long)(int)((ulong)((long)(this->hw_chans).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->hw_chans).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  psVar2 = local_1b0;
  std::__cxx11::stringbuf::str();
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string NTrodeObj::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "    ";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "Printing 'NTrodeObj'\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -id : " << id << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -hw_chans vector size[" << hw_chans.size() << "]:\n";
    for (int i = 0; i < (int)hw_chans.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : " << hw_chans.at(i) << "\n";
    }
    return(oss.str());
}